

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O0

void baryonyx::itm::init_with_random
               (bit_array *x,random_engine *rng,int variables,double init_ramdom)

{
  result_type_conflict2 rVar1;
  int local_34;
  int i;
  bernoulli_distribution dist;
  double init_ramdom_local;
  int variables_local;
  random_engine *rng_local;
  bit_array *x_local;
  
  dist._M_param._M_p = (param_type)(param_type)init_ramdom;
  std::bernoulli_distribution::bernoulli_distribution
            ((bernoulli_distribution *)&stack0xffffffffffffffd0,init_ramdom);
  for (local_34 = 0; local_34 != variables; local_34 = local_34 + 1) {
    rVar1 = std::bernoulli_distribution::operator()
                      ((bernoulli_distribution *)&stack0xffffffffffffffd0,rng);
    if (rVar1) {
      bit_array_impl::set(&x->super_bit_array_impl,local_34);
    }
    else {
      bit_array_impl::unset(&x->super_bit_array_impl,local_34);
    }
  }
  return;
}

Assistant:

inline void
init_with_random(bit_array& x,
                 random_engine& rng,
                 const int variables,
                 const double init_ramdom) noexcept
{
    std::bernoulli_distribution dist(init_ramdom);

    for (int i = 0; i != variables; ++i)
        if (dist(rng))
            x.set(i);
        else
            x.unset(i);
}